

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_fileWatcher.cpp
# Opt level: O0

char getch(void)

{
  int iVar1;
  undefined1 local_8c [8];
  termios tm_old;
  int ch;
  int fd;
  termios tm;
  
  tm_old.c_ospeed = 0;
  iVar1 = tcgetattr(0,(termios *)&ch);
  if (iVar1 < 0) {
    tm.c_ispeed._3_1_ = -1;
  }
  else {
    memcpy(local_8c,&ch,0x3c);
    cfmakeraw((termios *)&ch);
    iVar1 = tcsetattr(tm_old.c_ospeed,0,(termios *)&ch);
    if (iVar1 < 0) {
      tm.c_ispeed._3_1_ = -1;
    }
    else {
      tm_old.c_ispeed = getchar();
      iVar1 = tcsetattr(tm_old.c_ospeed,0,(termios *)local_8c);
      if (iVar1 < 0) {
        tm.c_ispeed._3_1_ = -1;
      }
      else {
        tm.c_ispeed._3_1_ = (char)tm_old.c_ispeed;
      }
    }
  }
  return tm.c_ispeed._3_1_;
}

Assistant:

char getch() {
    // https://blog.csdn.net/gaopu12345/article/details/30467099
    struct termios tm;
    int fd = 0, ch;
    if(tcgetattr(fd, &tm) < 0) {
        return -1;
    }
    auto tm_old = tm;
    cfmakeraw(&tm);
    if(tcsetattr(fd, TCSANOW, &tm) < 0) {
        return -1;
    }
    ch = getchar();
    if(tcsetattr(fd, TCSANOW, &tm_old) < 0) {
        return -1;
    }
    return ch;
}